

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O1

int KINGetNumPrecEvals(void *kinmem,long *npevals)

{
  int iVar1;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  KINLsMem local_18;
  KINMem local_10;
  
  iVar1 = kinLs_AccessLMem(kinmem,"KINGetNumPrecEvals",&local_10,&local_18);
  if (iVar1 == 0) {
    *npevals = local_18->npe;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINGetNumPrecEvals(void *kinmem, long int *npevals)
{
  KINMem   kin_mem;
  KINLsMem kinls_mem;
  int      retval;

  /* access KINLsMem structure; set output value and return */
  retval = kinLs_AccessLMem(kinmem, "KINGetNumPrecEvals",
                            &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS)  return(retval);
  *npevals = kinls_mem->npe;
  return(KINLS_SUCCESS);
}